

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterproperties.cpp
# Opt level: O0

UCPMap * anon_unknown.dwarf_38436b::makeMap(UProperty property,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UCPTrieType UVar3;
  int32_t iVar4;
  UMutableCPTrie *pUVar5;
  UnicodeSet *this;
  UCPTrieValueWidth local_6c;
  int32_t max;
  UCPTrieValueWidth valueWidth;
  UCPTrieType type;
  uint32_t nextValue;
  UChar32 c;
  UChar32 rangeEnd;
  int32_t i;
  uint32_t value;
  UChar32 start;
  int32_t numRanges;
  UnicodeSet *inclusions;
  LocalUMutableCPTriePointer mutableTrie;
  uint32_t nullValue;
  UErrorCode *errorCode_local;
  UCPTrie *pUStack_10;
  UProperty property_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    mutableTrie.super_LocalPointerBase<UMutableCPTrie>.ptr._4_4_ = 0;
    if (property == UCHAR_SCRIPT) {
      mutableTrie.super_LocalPointerBase<UMutableCPTrie>.ptr._4_4_ = 0x67;
    }
    pUVar5 = umutablecptrie_open_63
                       (mutableTrie.super_LocalPointerBase<UMutableCPTrie>.ptr._4_4_,
                        mutableTrie.super_LocalPointerBase<UMutableCPTrie>.ptr._4_4_,errorCode);
    icu_63::LocalUMutableCPTriePointer::LocalUMutableCPTriePointer
              ((LocalUMutableCPTriePointer *)&inclusions,pUVar5);
    this = icu_63::CharacterProperties::getInclusionsForProperty(property,errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 == '\0') {
      iVar2 = icu_63::UnicodeSet::getRangeCount(this);
      i = 0;
      rangeEnd = mutableTrie.super_LocalPointerBase<UMutableCPTrie>.ptr._4_4_;
      for (c = 0; c < iVar2; c = c + 1) {
        UVar3 = icu_63::UnicodeSet::getRangeEnd(this,c);
        for (type = icu_63::UnicodeSet::getRangeStart(this,c); type <= UVar3;
            type = type + UCPTRIE_TYPE_SMALL) {
          iVar4 = u_getIntPropertyValue_63(type,property);
          if (rangeEnd != iVar4) {
            if (rangeEnd != mutableTrie.super_LocalPointerBase<UMutableCPTrie>.ptr._4_4_) {
              pUVar5 = icu_63::LocalPointerBase<UMutableCPTrie>::getAlias
                                 ((LocalPointerBase<UMutableCPTrie> *)&inclusions);
              umutablecptrie_setRange_63(pUVar5,i,type + UCPTRIE_TYPE_ANY,rangeEnd,errorCode);
            }
            i = type;
            rangeEnd = iVar4;
          }
        }
      }
      if (rangeEnd != 0) {
        pUVar5 = icu_63::LocalPointerBase<UMutableCPTrie>::getAlias
                           ((LocalPointerBase<UMutableCPTrie> *)&inclusions);
        umutablecptrie_setRange_63(pUVar5,i,0x10ffff,rangeEnd,errorCode);
      }
      if ((property == UCHAR_BIDI_CLASS) || (property == UCHAR_GENERAL_CATEGORY)) {
        max = 0;
      }
      else {
        max = 1;
      }
      iVar2 = u_getIntPropertyMaxValue_63(property);
      if (iVar2 < 0x100) {
        local_6c = UCPTRIE_VALUE_BITS_8;
      }
      else {
        local_6c = (UCPTrieValueWidth)(0xffff < iVar2);
      }
      pUVar5 = icu_63::LocalPointerBase<UMutableCPTrie>::getAlias
                         ((LocalPointerBase<UMutableCPTrie> *)&inclusions);
      pUStack_10 = umutablecptrie_buildImmutable_63(pUVar5,max,local_6c,errorCode);
    }
    else {
      pUStack_10 = (UCPTrie *)0x0;
    }
    icu_63::LocalUMutableCPTriePointer::~LocalUMutableCPTriePointer
              ((LocalUMutableCPTriePointer *)&inclusions);
  }
  else {
    pUStack_10 = (UCPTrie *)0x0;
  }
  return (UCPMap *)pUStack_10;
}

Assistant:

UCPMap *makeMap(UProperty property, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return nullptr; }
    uint32_t nullValue = property == UCHAR_SCRIPT ? USCRIPT_UNKNOWN : 0;
    icu::LocalUMutableCPTriePointer mutableTrie(
        umutablecptrie_open(nullValue, nullValue, &errorCode));
    const UnicodeSet *inclusions =
        icu::CharacterProperties::getInclusionsForProperty(property, errorCode);
    if (U_FAILURE(errorCode)) { return nullptr; }
    int32_t numRanges = inclusions->getRangeCount();
    UChar32 start = 0;
    uint32_t value = nullValue;

    for (int32_t i = 0; i < numRanges; ++i) {
        UChar32 rangeEnd = inclusions->getRangeEnd(i);
        for (UChar32 c = inclusions->getRangeStart(i); c <= rangeEnd; ++c) {
            // TODO: Get a UCharacterProperty.IntProperty to avoid the property dispatch.
            uint32_t nextValue = u_getIntPropertyValue(c, property);
            if (value != nextValue) {
                if (value != nullValue) {
                    umutablecptrie_setRange(mutableTrie.getAlias(), start, c - 1, value, &errorCode);
                }
                start = c;
                value = nextValue;
            }
        }
    }
    if (value != 0) {
        umutablecptrie_setRange(mutableTrie.getAlias(), start, 0x10FFFF, value, &errorCode);
    }

    UCPTrieType type;
    if (property == UCHAR_BIDI_CLASS || property == UCHAR_GENERAL_CATEGORY) {
        type = UCPTRIE_TYPE_FAST;
    } else {
        type = UCPTRIE_TYPE_SMALL;
    }
    UCPTrieValueWidth valueWidth;
    // TODO: UCharacterProperty.IntProperty
    int32_t max = u_getIntPropertyMaxValue(property);
    if (max <= 0xff) {
        valueWidth = UCPTRIE_VALUE_BITS_8;
    } else if (max <= 0xffff) {
        valueWidth = UCPTRIE_VALUE_BITS_16;
    } else {
        valueWidth = UCPTRIE_VALUE_BITS_32;
    }
    return reinterpret_cast<UCPMap *>(
        umutablecptrie_buildImmutable(mutableTrie.getAlias(), type, valueWidth, &errorCode));
}